

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O0

void flatbuffers::tests::IntegerOutOfRangeTest(void)

{
  anon_unknown_0::TestError_
            ("table T { F:byte; } root_type T; { F:128 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xb9,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:byte; } root_type T; { F:-129 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xbb,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:ubyte; } root_type T; { F:256 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xbd,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:ubyte; } root_type T; { F:-1 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xbf,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:short; } root_type T; { F:32768 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xc1,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:short; } root_type T; { F:-32769 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xc3,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:ushort; } root_type T; { F:65536 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xc5,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:ushort; } root_type T; { F:-1 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,199,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:int; } root_type T; { F:2147483648 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xc9,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:int; } root_type T; { F:-2147483649 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xcb,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:uint; } root_type T; { F:4294967296 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xcd,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table T { F:uint; } root_type T; { F:-1 }","constant does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xcf,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint8; } root_type X; { Y: -1 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd1,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint8; } root_type X; { Y: 256 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd2,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint16; } root_type X; { Y: -1 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd3,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint16; } root_type X; { Y: 65536 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd4,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint32; } root_type X; { Y: -1 }","",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd5,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint32; } root_type X; { Y: 4294967296 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd7,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64; } root_type X; { Y: -1 }","",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xd8,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64; } root_type X; { Y: -9223372036854775809 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xda,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64; } root_type X; { Y: 18446744073709551616 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xdc,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int8; } root_type X; { Y: -129 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xde,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int8; } root_type X; { Y: 128 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xdf,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int16; } root_type X; { Y: -32769 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe0,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int16; } root_type X; { Y: 32768 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe1,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int32; } root_type X; { Y: -2147483649 }","",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe2,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int32; } root_type X; { Y: 2147483648 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe4,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int64; } root_type X; { Y: -9223372036854775809 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe6,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int64; } root_type X; { Y: 9223372036854775808 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xe8,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int8; } root_type X; { Y: -9223372036854775809 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xeb,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int8; } root_type X; { Y: 9223372036854775808 }","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xed,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int64=-9223372036854775809; } root_type X; {}","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xf1,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:int64= 9223372036854775808; } root_type X; {}","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xf3,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64; } root_type X; { Y: -1 }","",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xf4,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64=-9223372036854775809; } root_type X; {}","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xf6,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  anon_unknown_0::TestError_
            ("table X { Y:uint64= 18446744073709551616; } root_type X; {}","does not fit",
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/tests/parser_test.cpp"
             ,0xf8,"void flatbuffers::tests::IntegerOutOfRangeTest()");
  return;
}

Assistant:

void IntegerOutOfRangeTest() {
  TestError("table T { F:byte; } root_type T; { F:128 }",
            "constant does not fit");
  TestError("table T { F:byte; } root_type T; { F:-129 }",
            "constant does not fit");
  TestError("table T { F:ubyte; } root_type T; { F:256 }",
            "constant does not fit");
  TestError("table T { F:ubyte; } root_type T; { F:-1 }",
            "constant does not fit");
  TestError("table T { F:short; } root_type T; { F:32768 }",
            "constant does not fit");
  TestError("table T { F:short; } root_type T; { F:-32769 }",
            "constant does not fit");
  TestError("table T { F:ushort; } root_type T; { F:65536 }",
            "constant does not fit");
  TestError("table T { F:ushort; } root_type T; { F:-1 }",
            "constant does not fit");
  TestError("table T { F:int; } root_type T; { F:2147483648 }",
            "constant does not fit");
  TestError("table T { F:int; } root_type T; { F:-2147483649 }",
            "constant does not fit");
  TestError("table T { F:uint; } root_type T; { F:4294967296 }",
            "constant does not fit");
  TestError("table T { F:uint; } root_type T; { F:-1 }",
            "constant does not fit");
  // Check fixed width aliases
  TestError("table X { Y:uint8; } root_type X; { Y: -1 }", "does not fit");
  TestError("table X { Y:uint8; } root_type X; { Y: 256 }", "does not fit");
  TestError("table X { Y:uint16; } root_type X; { Y: -1 }", "does not fit");
  TestError("table X { Y:uint16; } root_type X; { Y: 65536 }", "does not fit");
  TestError("table X { Y:uint32; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint32; } root_type X; { Y: 4294967296 }",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint64; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: 18446744073709551616 }",
            "does not fit");

  TestError("table X { Y:int8; } root_type X; { Y: -129 }", "does not fit");
  TestError("table X { Y:int8; } root_type X; { Y: 128 }", "does not fit");
  TestError("table X { Y:int16; } root_type X; { Y: -32769 }", "does not fit");
  TestError("table X { Y:int16; } root_type X; { Y: 32768 }", "does not fit");
  TestError("table X { Y:int32; } root_type X; { Y: -2147483649 }", "");
  TestError("table X { Y:int32; } root_type X; { Y: 2147483648 }",
            "does not fit");
  TestError("table X { Y:int64; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:int64; } root_type X; { Y: 9223372036854775808 }",
            "does not fit");
  // check out-of-int64 as int8
  TestError("table X { Y:int8; } root_type X; { Y: -9223372036854775809 }",
            "does not fit");
  TestError("table X { Y:int8; } root_type X; { Y: 9223372036854775808 }",
            "does not fit");

  // Check default values
  TestError("table X { Y:int64=-9223372036854775809; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:int64= 9223372036854775808; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:uint64; } root_type X; { Y: -1 }", "");
  TestError("table X { Y:uint64=-9223372036854775809; } root_type X; {}",
            "does not fit");
  TestError("table X { Y:uint64= 18446744073709551616; } root_type X; {}",
            "does not fit");
}